

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool local_233;
  exception *ex;
  undefined1 local_200 [7];
  bool ok;
  database db;
  undefined1 local_d8 [112];
  undefined1 local_68 [8];
  switches opt;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  opt.string_mode = false;
  opt._69_3_ = 0;
  switches::switches((switches *)local_68);
  get_switches((pair<switches,_int> *)(local_d8 + 0x20),argc,argv);
  std::tie<switches,int>((switches *)local_d8,(int *)local_68);
  std::tuple<switches&,int&>::operator=
            ((tuple<switches&,int&> *)local_d8,(pair<switches,_int> *)(local_d8 + 0x20));
  std::pair<switches,_int>::~pair((pair<switches,_int> *)(local_d8 + 0x20));
  if (opt._68_4_ == 0) {
    pstore::database::database((database *)local_200,(string *)local_68,read_only,true);
    pstore::database::sync((database *)local_200);
    if ((opt._60_1_ & 1) == 0) {
      local_233 = anon_unknown.dwarf_19fa5::read_names_index
                            ((database *)local_200,(string *)&opt.field_0x18);
    }
    else {
      local_233 = anon_unknown.dwarf_19fa5::read_strings_index
                            ((database *)local_200,(string *)&opt.field_0x18);
    }
    opt._68_4_ = ZEXT14(local_233 == false);
    pstore::database::~database((database *)local_200);
    db._284_4_ = 0;
  }
  else {
    argv_local._4_4_ = opt._68_4_;
    db._284_4_ = 1;
  }
  switches::~switches((switches *)local_68);
  if (db._284_4_ == 0) {
    argv_local._4_4_ = opt._68_4_;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    PSTORE_TRY {
        switches opt;
        std::tie (opt, exit_code) = get_switches (argc, argv);
        if (exit_code != EXIT_SUCCESS) {
            return exit_code;
        }

        pstore::database db{opt.db_path, pstore::database::access_mode::read_only};
        db.sync (opt.revision);

        bool const ok =
            opt.string_mode ? read_strings_index (db, opt.key) : read_names_index (db, opt.key);
        exit_code = ok ? EXIT_SUCCESS : EXIT_FAILURE;
    }